

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1ConvolveYHighbdTest_RunTest_Test::TestBody
          (AV1ConvolveYHighbdTest_RunTest_Test *this)

{
  AV1ConvolveYHighbdTest *in_stack_00000010;
  
  AV1ConvolveYHighbdTest::RunTest(in_stack_00000010);
  return;
}

Assistant:

TEST_P(AV1ConvolveYHighbdTest, RunTest) { RunTest(); }